

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O2

void __thiscall
cbtConvexHullInternal::Pool<cbtConvexHullInternal::Face>::~Pool
          (Pool<cbtConvexHullInternal::Face> *this)

{
  PoolArray<cbtConvexHullInternal::Face> *this_00;
  
  while (this_00 = this->arrays, this_00 != (PoolArray<cbtConvexHullInternal::Face> *)0x0) {
    this->arrays = this_00->next;
    PoolArray<cbtConvexHullInternal::Face>::~PoolArray(this_00);
    cbtAlignedFreeInternal(this_00);
  }
  return;
}

Assistant:

~Pool()
		{
			while (arrays)
			{
				PoolArray<T>* p = arrays;
				arrays = p->next;
				p->~PoolArray<T>();
				cbtAlignedFree(p);
			}
		}